

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Symbol *s)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 uStack_28;
  
  if ((int)(s->icl >> 0x1c) != 0) {
    uVar1 = 0;
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT17((s->val).str[uVar1],(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 7),1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (s->icl >> 0x1c & 0xffffffff));
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Symbol& s) {
	for (u32 i=0; i<s.length(); i++)
		out << s.val.str[i];
	return out;
}